

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_neon_pmull_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  int32_t iVar1;
  uint64_t uVar2;
  uint64_t op2;
  uint64_t uVar3;
  uint64_t uVar4;
  uintptr_t max_sz;
  uint64_t mm;
  uint64_t nn;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  int hi;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  iVar1 = simd_data(desc);
  uVar3 = *(uint64_t *)((long)vn + (long)iVar1 * 8);
  uVar4 = *(uint64_t *)((long)vm + (long)iVar1 * 8);
  uVar2 = expand_byte_to_half(uVar3);
  op2 = expand_byte_to_half(uVar4);
  uVar2 = pmull_h(uVar2,op2);
  *(uint64_t *)vd = uVar2;
  uVar3 = expand_byte_to_half(uVar3 >> 0x20);
  uVar4 = expand_byte_to_half(uVar4 >> 0x20);
  uVar3 = pmull_h(uVar3,uVar4);
  *(uint64_t *)((long)vd + 8) = uVar3;
  max_sz = simd_maxsz(desc);
  clear_tail(vd,0x10,max_sz);
  return;
}

Assistant:

void HELPER(neon_pmull_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    int hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t nn = n[hi], mm = m[hi];

    d[0] = pmull_h(expand_byte_to_half(nn), expand_byte_to_half(mm));
    nn >>= 32;
    mm >>= 32;
    d[1] = pmull_h(expand_byte_to_half(nn), expand_byte_to_half(mm));

    clear_tail(d, 16, simd_maxsz(desc));
}